

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<double,double,duckdb::ArgMinMaxState<double,double>>
               (ArgMinMaxState<double,_double> *state,double x_data,double y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  BY_TYPE_conflict1 local_28;
  ARG_TYPE_conflict1 local_20;
  
  local_28 = y_data;
  local_20 = x_data;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if (bVar1) {
    bVar1 = duckdb::GreaterThan::Operation<double>(&state->value,&local_28);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx
                        );
      (state->super_ArgMinMaxStateBase).arg_null = !bVar1;
      if (bVar1) {
        state->arg = local_20;
      }
      state->value = local_28;
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}